

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O1

Uint32 Diligent::FindResource
                 (PipelineResourceDesc *Resources,Uint32 NumResources,SHADER_TYPE ShaderStage,
                 char *ResourceName)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  SHADER_TYPE *pSVar4;
  string msg;
  Uint32 local_54;
  string local_50;
  
  if ((ResourceName == (char *)0x0) || (*ResourceName == '\0')) {
    FormatString<char[26],char[51]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResourceName != nullptr && ResourceName[0] != \'\\0\'",
               (char (*) [51])ResourceName);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"FindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x163);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (NumResources != 0) {
    pSVar4 = &Resources->ShaderStages;
    uVar3 = 0;
    do {
      bVar1 = true;
      if (((*pSVar4 & ShaderStage) != SHADER_TYPE_UNKNOWN) &&
         (iVar2 = strcmp(((PipelineResourceDesc *)(pSVar4 + -2))->Name,ResourceName), iVar2 == 0)) {
        bVar1 = false;
        local_54 = (Uint32)uVar3;
      }
      if (!bVar1) {
        return local_54;
      }
      uVar3 = uVar3 + 1;
      pSVar4 = pSVar4 + 6;
    } while (NumResources != uVar3);
  }
  return 0xffffffff;
}

Assistant:

Uint32 FindResource(const PipelineResourceDesc Resources[],
                    Uint32                     NumResources,
                    SHADER_TYPE                ShaderStage,
                    const char*                ResourceName)
{
    VERIFY_EXPR(ResourceName != nullptr && ResourceName[0] != '\0');
    for (Uint32 r = 0; r < NumResources; ++r)
    {
        const PipelineResourceDesc& ResDesc{Resources[r]};
        if ((ResDesc.ShaderStages & ShaderStage) != 0 && strcmp(ResDesc.Name, ResourceName) == 0)
            return r;
    }

    return InvalidPipelineResourceIndex;
}